

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_encode_cblk(opj_t1_t *t1,opj_tcd_cblk_enc_t *cblk,OPJ_UINT32 orient,OPJ_UINT32 compno,
                       OPJ_UINT32 level,OPJ_UINT32 qmfbid,OPJ_FLOAT64 stepsize,OPJ_UINT32 cblksty,
                       OPJ_UINT32 numcomps,opj_tcd_tile_t *tile,OPJ_FLOAT64 *mct_norms,
                       OPJ_UINT32 mct_numcomps)

{
  OPJ_INT32 OVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  opj_tcd_pass_t *poVar4;
  bool type_00;
  OPJ_FLOAT64 OVar5;
  OPJ_UINT32 local_a4;
  OPJ_UINT32 local_94;
  opj_tcd_pass_t *pass_2;
  opj_tcd_pass_t *pass_1;
  OPJ_UINT32 last_pass_rate;
  OPJ_UINT32 rate_extra_bytes;
  opj_tcd_pass_t *pass;
  OPJ_INT32 tmp;
  OPJ_FLOAT64 tempwmsedec;
  uint uStack_58;
  OPJ_BYTE type;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_INT32 max;
  OPJ_INT32 nmsedec;
  OPJ_UINT32 passtype;
  OPJ_INT32 bpno;
  OPJ_UINT32 passno;
  opj_mqc_t *mqc;
  OPJ_FLOAT64 cumwmsedec;
  OPJ_FLOAT64 stepsize_local;
  OPJ_UINT32 qmfbid_local;
  OPJ_UINT32 level_local;
  OPJ_UINT32 compno_local;
  OPJ_UINT32 orient_local;
  opj_tcd_cblk_enc_t *cblk_local;
  opj_t1_t *t1_local;
  
  mqc = (opj_mqc_t *)0x0;
  i = 0;
  (t1->mqc).lut_ctxno_zc_orient = "" + (orient << 9);
  j = 0;
  _bpno = t1;
  cumwmsedec = stepsize;
  stepsize_local._0_4_ = qmfbid;
  stepsize_local._4_4_ = level;
  qmfbid_local = compno;
  level_local = orient;
  _compno_local = cblk;
  cblk_local = (opj_tcd_cblk_enc_t *)t1;
  for (uStack_58 = 0; uStack_58 < cblk_local[3].numbps; uStack_58 = uStack_58 + 1) {
    for (tempwmsedec._4_4_ = 0; tempwmsedec._4_4_ < cblk_local[3].numlenbits;
        tempwmsedec._4_4_ = tempwmsedec._4_4_ + 1) {
      iVar2 = *(int *)(*(long *)&cblk_local[3].x0 +
                      (ulong)(uStack_58 + tempwmsedec._4_4_ * cblk_local[3].numpassesinlayers) * 4);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      j = opj_int_max(j,iVar2);
    }
  }
  if (j == 0) {
    local_94 = 0;
  }
  else {
    OVar1 = opj_int_floorlog2(j);
    local_94 = OVar1 - 5;
  }
  _compno_local->numbps = local_94;
  if (_compno_local->numbps == 0) {
    _compno_local->totalpasses = 0;
  }
  else {
    nmsedec = _compno_local->numbps - 1;
    max = 2;
    opj_mqc_resetstates(&_bpno->mqc);
    opj_mqc_setstate(&_bpno->mqc,0x12,0,0x2e);
    opj_mqc_setstate(&_bpno->mqc,0x11,0,3);
    opj_mqc_setstate(&_bpno->mqc,0,0,4);
    opj_mqc_init_enc(&_bpno->mqc,_compno_local->data);
    passtype = 0;
    while (-1 < nmsedec) {
      poVar4 = _compno_local->passes + passtype;
      type_00 = false;
      if ((nmsedec < (int)(_compno_local->numbps - 4)) && (type_00 = false, (uint)max < 2)) {
        type_00 = (cblksty & 1) != 0;
      }
      if ((passtype != 0) && ((_compno_local->passes[passtype - 1].field_0x14 & 1) != 0)) {
        if (type_00) {
          opj_mqc_bypass_init_enc(&_bpno->mqc);
        }
        else {
          opj_mqc_restart_init_enc(&_bpno->mqc);
        }
      }
      if (max == 0) {
        opj_t1_enc_sigpass((opj_t1_t *)cblk_local,nmsedec,(OPJ_INT32 *)&i,type_00,cblksty);
      }
      else if (max == 1) {
        opj_t1_enc_refpass((opj_t1_t *)cblk_local,nmsedec,(OPJ_INT32 *)&i,type_00);
      }
      else if ((max == 2) &&
              (opj_t1_enc_clnpass((opj_t1_t *)cblk_local,nmsedec,(OPJ_INT32 *)&i,cblksty),
              (cblksty & 0x20) != 0)) {
        opj_mqc_segmark_enc(&_bpno->mqc);
      }
      OVar5 = opj_t1_getwmsedec(i,qmfbid_local,stepsize_local._4_4_,level_local,nmsedec,
                                stepsize_local._0_4_,cumwmsedec,numcomps,mct_norms,mct_numcomps);
      mqc = (opj_mqc_t *)((double)OVar5 + (double)mqc);
      tile->distotile = (OPJ_FLOAT64)((double)OVar5 + (double)tile->distotile);
      poVar4->distortiondec = (OPJ_FLOAT64)mqc;
      iVar2 = opj_t1_enc_is_term_pass(_compno_local,cblksty,nmsedec,max);
      if (iVar2 == 0) {
        if (type_00) {
          pass_1._4_4_ = opj_mqc_bypass_get_extra_bytes(&_bpno->mqc,cblksty & 0x10);
        }
        else {
          pass_1._4_4_ = 3;
        }
        poVar4->field_0x14 = poVar4->field_0x14 & 0xfe;
        OVar3 = opj_mqc_numbytes(&_bpno->mqc);
        poVar4->rate = OVar3 + pass_1._4_4_;
      }
      else {
        if (type_00) {
          opj_mqc_bypass_flush_enc(&_bpno->mqc,cblksty & 0x10);
        }
        else if ((cblksty & 0x10) == 0) {
          opj_mqc_flush(&_bpno->mqc);
        }
        else {
          opj_mqc_erterm_enc(&_bpno->mqc);
        }
        poVar4->field_0x14 = poVar4->field_0x14 & 0xfe | 1;
        OVar3 = opj_mqc_numbytes(&_bpno->mqc);
        poVar4->rate = OVar3;
      }
      max = max + 1;
      if (max == 3) {
        max = 0;
        nmsedec = nmsedec + -1;
      }
      if ((cblksty & 2) != 0) {
        opj_mqc_reset_enc(&_bpno->mqc);
      }
      passtype = passtype + 1;
    }
    _compno_local->totalpasses = passtype;
    if (_compno_local->totalpasses != 0) {
      pass_1._0_4_ = opj_mqc_numbytes(&_bpno->mqc);
      passtype = _compno_local->totalpasses;
      while (passtype != 0) {
        passtype = passtype - 1;
        poVar4 = _compno_local->passes + passtype;
        if ((OPJ_UINT32)pass_1 < poVar4->rate) {
          poVar4->rate = (OPJ_UINT32)pass_1;
        }
        else {
          pass_1._0_4_ = poVar4->rate;
        }
      }
    }
    for (passtype = 0; passtype < _compno_local->totalpasses; passtype = passtype + 1) {
      poVar4 = _compno_local->passes + passtype;
      if (poVar4->rate == 0) {
        __assert_fail("pass->rate > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                      ,0x966,
                      "void opj_t1_encode_cblk(opj_t1_t *, opj_tcd_cblk_enc_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_FLOAT64, OPJ_UINT32, OPJ_UINT32, opj_tcd_tile_t *, const OPJ_FLOAT64 *, OPJ_UINT32)"
                     );
      }
      if (_compno_local->data[poVar4->rate - 1] == 0xff) {
        poVar4->rate = poVar4->rate - 1;
      }
      if (passtype == 0) {
        local_a4 = 0;
      }
      else {
        local_a4 = _compno_local->passes[passtype - 1].rate;
      }
      poVar4->len = poVar4->rate - local_a4;
    }
  }
  return;
}

Assistant:

static void opj_t1_encode_cblk(opj_t1_t *t1,
                               opj_tcd_cblk_enc_t* cblk,
                               OPJ_UINT32 orient,
                               OPJ_UINT32 compno,
                               OPJ_UINT32 level,
                               OPJ_UINT32 qmfbid,
                               OPJ_FLOAT64 stepsize,
                               OPJ_UINT32 cblksty,
                               OPJ_UINT32 numcomps,
                               opj_tcd_tile_t * tile,
                               const OPJ_FLOAT64 * mct_norms,
                               OPJ_UINT32 mct_numcomps)
{
    OPJ_FLOAT64 cumwmsedec = 0.0;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */

    OPJ_UINT32 passno;
    OPJ_INT32 bpno;
    OPJ_UINT32 passtype;
    OPJ_INT32 nmsedec = 0;
    OPJ_INT32 max;
    OPJ_UINT32 i, j;
    OPJ_BYTE type = T1_TYPE_MQ;
    OPJ_FLOAT64 tempwmsedec;

#ifdef EXTRA_DEBUG
    printf("encode_cblk(x=%d,y=%d,x1=%d,y1=%d,orient=%d,compno=%d,level=%d\n",
           cblk->x0, cblk->y0, cblk->x1, cblk->y1, orient, compno, level);
#endif

    mqc->lut_ctxno_zc_orient = lut_ctxno_zc + (orient << 9);

    max = 0;
    for (i = 0; i < t1->w; ++i) {
        for (j = 0; j < t1->h; ++j) {
            OPJ_INT32 tmp = abs(t1->data[i + j * t1->data_stride]);
            max = opj_int_max(max, tmp);
        }
    }

    cblk->numbps = max ? (OPJ_UINT32)((opj_int_floorlog2(max) + 1) -
                                      T1_NMSEDEC_FRACBITS) : 0;
    if (cblk->numbps == 0) {
        cblk->totalpasses = 0;
        return;
    }

    bpno = (OPJ_INT32)(cblk->numbps - 1);
    passtype = 2;

    opj_mqc_resetstates(mqc);
    opj_mqc_setstate(mqc, T1_CTXNO_UNI, 0, 46);
    opj_mqc_setstate(mqc, T1_CTXNO_AGG, 0, 3);
    opj_mqc_setstate(mqc, T1_CTXNO_ZC, 0, 4);
    opj_mqc_init_enc(mqc, cblk->data);

    for (passno = 0; bpno >= 0; ++passno) {
        opj_tcd_pass_t *pass = &cblk->passes[passno];
        type = ((bpno < ((OPJ_INT32)(cblk->numbps) - 4)) && (passtype < 2) &&
                (cblksty & J2K_CCP_CBLKSTY_LAZY)) ? T1_TYPE_RAW : T1_TYPE_MQ;

        /* If the previous pass was terminating, we need to reset the encoder */
        if (passno > 0 && cblk->passes[passno - 1].term) {
            if (type == T1_TYPE_RAW) {
                opj_mqc_bypass_init_enc(mqc);
            } else {
                opj_mqc_restart_init_enc(mqc);
            }
        }

        switch (passtype) {
        case 0:
            opj_t1_enc_sigpass(t1, bpno, &nmsedec, type, cblksty);
            break;
        case 1:
            opj_t1_enc_refpass(t1, bpno, &nmsedec, type);
            break;
        case 2:
            opj_t1_enc_clnpass(t1, bpno, &nmsedec, cblksty);
            /* code switch SEGMARK (i.e. SEGSYM) */
            if (cblksty & J2K_CCP_CBLKSTY_SEGSYM) {
                opj_mqc_segmark_enc(mqc);
            }
            break;
        }

        /* fixed_quality */
        tempwmsedec = opj_t1_getwmsedec(nmsedec, compno, level, orient, bpno, qmfbid,
                                        stepsize, numcomps, mct_norms, mct_numcomps) ;
        cumwmsedec += tempwmsedec;
        tile->distotile += tempwmsedec;
        pass->distortiondec = cumwmsedec;

        if (opj_t1_enc_is_term_pass(cblk, cblksty, bpno, passtype)) {
            /* If it is a terminated pass, terminate it */
            if (type == T1_TYPE_RAW) {
                opj_mqc_bypass_flush_enc(mqc, cblksty & J2K_CCP_CBLKSTY_PTERM);
            } else {
                if (cblksty & J2K_CCP_CBLKSTY_PTERM) {
                    opj_mqc_erterm_enc(mqc);
                } else {
                    opj_mqc_flush(mqc);
                }
            }
            pass->term = 1;
            pass->rate = opj_mqc_numbytes(mqc);
        } else {
            /* Non terminated pass */
            OPJ_UINT32 rate_extra_bytes;
            if (type == T1_TYPE_RAW) {
                rate_extra_bytes = opj_mqc_bypass_get_extra_bytes(
                                       mqc, (cblksty & J2K_CCP_CBLKSTY_PTERM));
            } else {
                rate_extra_bytes = 3;
            }
            pass->term = 0;
            pass->rate = opj_mqc_numbytes(mqc) + rate_extra_bytes;
        }

        if (++passtype == 3) {
            passtype = 0;
            bpno--;
        }

        /* Code-switch "RESET" */
        if (cblksty & J2K_CCP_CBLKSTY_RESET) {
            opj_mqc_reset_enc(mqc);
        }
    }

    cblk->totalpasses = passno;

    if (cblk->totalpasses) {
        /* Make sure that pass rates are increasing */
        OPJ_UINT32 last_pass_rate = opj_mqc_numbytes(mqc);
        for (passno = cblk->totalpasses; passno > 0;) {
            opj_tcd_pass_t *pass = &cblk->passes[--passno];
            if (pass->rate > last_pass_rate) {
                pass->rate = last_pass_rate;
            } else {
                last_pass_rate = pass->rate;
            }
        }
    }

    for (passno = 0; passno < cblk->totalpasses; passno++) {
        opj_tcd_pass_t *pass = &cblk->passes[passno];

        /* Prevent generation of FF as last data byte of a pass*/
        /* For terminating passes, the flushing procedure ensured this already */
        assert(pass->rate > 0);
        if (cblk->data[pass->rate - 1] == 0xFF) {
            pass->rate--;
        }
        pass->len = pass->rate - (passno == 0 ? 0 : cblk->passes[passno - 1].rate);
    }

#ifdef EXTRA_DEBUG
    printf(" len=%d\n", (cblk->totalpasses) ? opj_mqc_numbytes(mqc) : 0);

    /* Check that there not 0xff >=0x90 sequences */
    if (cblk->totalpasses) {
        OPJ_UINT32 i;
        OPJ_UINT32 len = opj_mqc_numbytes(mqc);
        for (i = 1; i < len; ++i) {
            if (cblk->data[i - 1] == 0xff && cblk->data[i] >= 0x90) {
                printf("0xff %02x at offset %d\n", cblk->data[i], i - 1);
                abort();
            }
        }
    }
#endif
}